

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::readArrayBasedContainer<QList<unsigned_int>>(QDataStream *s,QList<unsigned_int> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  undefined1 *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<unsigned_int>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (undefined1 *)(ulong)local_3c;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < *(int *)(s + 0x18)) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(longlong *)&local_48);
      asize = local_48;
      if ((long)local_48 < 0) goto LAB_0017ad64;
    }
  }
  else if (local_3c == 0xffffffff) {
LAB_0017ad64:
    QDataStream::setStatus((Status)s);
    goto LAB_0017adfd;
  }
  QList<unsigned_int>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    do {
      local_3c = 0xaaaaaaaa;
      QDataStream::operator>>(s,(int *)&local_3c);
      if (s[0x13] != (QDataStream)0x0) {
        QList<unsigned_int>::clear(c);
        break;
      }
      local_48 = (undefined1 *)CONCAT44(local_48._4_4_,local_3c);
      QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
                ((QPodArrayOps<unsigned_int> *)c,(c->d).size,(uint *)&local_48);
      QList<unsigned_int>::end(c);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_0017adfd:
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}